

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetPropertyScoped<true,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,FrameDisplay *pDisplay,PropertyId propertyId,
              Var defaultInstance)

{
  bool bVar1;
  BOOL BVar2;
  ModuleID moduleID;
  ScriptContext *requestContext;
  void *aValue;
  RecyclableObject *pRVar3;
  DynamicObject *object;
  Var pvVar4;
  int32 hCode;
  uint index;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  UndeclaredBlockVariable *local_48;
  Var value;
  uint local_38;
  InlineCacheIndex local_34;
  
  value = inlineCache;
  local_34 = inlineCacheIndex;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_38 = (uint)pDisplay->length;
  index = 0;
  local_a8 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  info._56_8_ = pDisplay;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,(PolymorphicInlineCache *)value,local_34,
             false);
  if (local_38 != 0) {
    do {
      aValue = FrameDisplay::GetItem((FrameDisplay *)info._56_8_,index);
      pRVar3 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      bVar1 = CacheOperators::TryGetProperty<true,true,true,false,true,true,false,true,false,false>
                        (pRVar3,false,pRVar3,propertyId,&local_48,requestContext,
                         (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a8);
      if (bVar1) {
        return local_48;
      }
      bVar1 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
      if ((bVar1) && (DAT_015bc46a == '\x01')) {
        CacheOperators::TraceCache
                  ((PolymorphicInlineCache *)value,L"PatchGetPropertyScoped",propertyId,
                   requestContext,pRVar3);
      }
      BVar2 = GetProperty_Internal<false>
                        (pRVar3,pRVar3,false,propertyId,&local_48,requestContext,
                         (PropertyValueInfo *)local_a8);
      if (BVar2 != 0) {
        if (propertyId == 0x2d5) {
          return local_48;
        }
        goto LAB_00ad6d56;
      }
      index = index + 1;
    } while (local_38 != index);
  }
  if (propertyId == 0x2d5) {
    pRVar3 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
    moduleID = FunctionBody::GetModuleID(functionBody);
    pvVar4 = OP_GetThis(pRVar3,moduleID,&requestContext->super_ScriptContextInfo);
    return pvVar4;
  }
  if (propertyId == 0x2d6) {
    hCode = -0x7ff5ebe7;
  }
  else {
    object = VarTo<Js::DynamicObject>(defaultInstance);
    local_48 = (UndeclaredBlockVariable *)
               PatchGetRootValue<true,Js::PolymorphicInlineCache>
                         (functionBody,(PolymorphicInlineCache *)value,local_34,object,propertyId);
LAB_00ad6d56:
    if ((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        != local_48) {
      return local_48;
    }
    hCode = -0x7ff5ec07;
  }
  JavascriptError::ThrowReferenceError(requestContext,hCode,(PCWSTR)0x0);
}

Assistant:

inline Var JavascriptOperators::PatchGetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyScoped);
        // Get the property, using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        uint16 length = pDisplay->GetLength();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        for (uint16 i = 0; i < length; i++)
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            Var value;
            if (CacheOperators::TryGetProperty<true, true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                    object, false, object, propertyId, &value, scriptContext, nullptr, &info))
            {
                return value;
            }

#if DBG_DUMP
            if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
            {
                CacheOperators::TraceCache(inlineCache, _u("PatchGetPropertyScoped"), propertyId, scriptContext, object);
            }
#endif
            if (JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, &info))
            {
                if (scriptContext->IsUndeclBlockVar(value) && propertyId != PropertyIds::_this)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
                return value;
            }
        }

        // There is no root decl for 'this', we should instead load the global 'this' value.
        if (propertyId == PropertyIds::_this)
        {
            Var varNull = OP_LdNull(scriptContext);
            return JavascriptOperators::OP_GetThis(varNull, functionBody->GetModuleID(), scriptContext);
        }
        else if (propertyId == PropertyIds::_super)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        // No one in the scope stack has the property, so get it from the default instance provided by the caller.
        Var value = JavascriptOperators::PatchGetRootValue<IsFromFullJit>(functionBody, inlineCache, inlineCacheIndex, VarTo<DynamicObject>(defaultInstance), propertyId);
        if (scriptContext->IsUndeclBlockVar(value))
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
        }
        return value;
        JIT_HELPER_END(Op_PatchGetPropertyScoped);
    }